

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

uint __thiscall wasm::Type::hasByteSize(Type *this)

{
  bool bVar1;
  Type *pTVar2;
  Type *t;
  Iterator __end2;
  Iterator __begin2;
  Type *__range2;
  Type *pTStack_18;
  anon_class_1_0_00000001 hasSingleByteSize;
  Type *this_local;
  
  pTStack_18 = this;
  bVar1 = isTuple(this);
  if (bVar1) {
    join_0x00000010_0x00000000_ =
         (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)begin(this);
    _t = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)end(this);
    while (bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                             ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                              &__end2.
                               super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                      *)&t), bVar1) {
      pTVar2 = Iterator::operator*((Iterator *)
                                   &__end2.
                                    super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                    .index);
      bVar1 = hasByteSize::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&__range2 + 7),(Type)pTVar2->id);
      if (!bVar1) {
        return 0;
      }
      ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                 &__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
    }
    this_local._4_4_ = 1;
  }
  else {
    bVar1 = hasByteSize::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&__range2 + 7),(Type)this->id);
    this_local._4_4_ = (uint)bVar1;
  }
  return this_local._4_4_;
}

Assistant:

unsigned Type::hasByteSize() const {
  auto hasSingleByteSize = [](Type t) { return t.isNumber(); };
  if (isTuple()) {
    for (const auto& t : *this) {
      if (!hasSingleByteSize(t)) {
        return false;
      }
    }
    return true;
  }
  return hasSingleByteSize(*this);
}